

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prog.cc
# Opt level: O1

void __thiscall duckdb_re2::Prog::~Prog(Prog *this)

{
  uchar *puVar1;
  Inst *pIVar2;
  unsigned_short *puVar3;
  
  DeleteDFA(this,this->dfa_longest_);
  DeleteDFA(this,this->dfa_first_);
  if ((this->prefix_foldcase_ == true) && ((this->field_11).prefix_dfa_ != (uint64_t *)0x0)) {
    operator_delete__((this->field_11).prefix_dfa_);
  }
  puVar1 = (this->onepass_nodes_).ptr_._M_t.
           super___uniq_ptr_impl<unsigned_char,_duckdb_re2::PODArray<unsigned_char>::Deleter>._M_t.
           super__Tuple_impl<0UL,_unsigned_char_*,_duckdb_re2::PODArray<unsigned_char>::Deleter>.
           super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
  if (puVar1 != (uchar *)0x0) {
    operator_delete(puVar1);
  }
  (this->onepass_nodes_).ptr_._M_t.
  super___uniq_ptr_impl<unsigned_char,_duckdb_re2::PODArray<unsigned_char>::Deleter>._M_t.
  super__Tuple_impl<0UL,_unsigned_char_*,_duckdb_re2::PODArray<unsigned_char>::Deleter>.
  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl = (uchar *)0x0;
  pIVar2 = (this->inst_).ptr_._M_t.
           super___uniq_ptr_impl<duckdb_re2::Prog::Inst,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb_re2::Prog::Inst_*,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
           .super__Head_base<0UL,_duckdb_re2::Prog::Inst_*,_false>._M_head_impl;
  if (pIVar2 != (Inst *)0x0) {
    operator_delete(pIVar2);
  }
  (this->inst_).ptr_._M_t.
  super___uniq_ptr_impl<duckdb_re2::Prog::Inst,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb_re2::Prog::Inst_*,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
  .super__Head_base<0UL,_duckdb_re2::Prog::Inst_*,_false>._M_head_impl = (Inst *)0x0;
  puVar3 = (this->list_heads_).ptr_._M_t.
           super___uniq_ptr_impl<unsigned_short,_duckdb_re2::PODArray<unsigned_short>::Deleter>._M_t
           .super__Tuple_impl<0UL,_unsigned_short_*,_duckdb_re2::PODArray<unsigned_short>::Deleter>.
           super__Head_base<0UL,_unsigned_short_*,_false>._M_head_impl;
  if (puVar3 != (unsigned_short *)0x0) {
    operator_delete(puVar3);
  }
  (this->list_heads_).ptr_._M_t.
  super___uniq_ptr_impl<unsigned_short,_duckdb_re2::PODArray<unsigned_short>::Deleter>._M_t.
  super__Tuple_impl<0UL,_unsigned_short_*,_duckdb_re2::PODArray<unsigned_short>::Deleter>.
  super__Head_base<0UL,_unsigned_short_*,_false>._M_head_impl = (unsigned_short *)0x0;
  return;
}

Assistant:

Prog::~Prog() {
  DeleteDFA(dfa_longest_);
  DeleteDFA(dfa_first_);
  if (prefix_foldcase_)
    delete[] prefix_dfa_;
}